

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int event_deferred_cb_schedule_(event_base *base,event_callback *cb)

{
  int local_1c;
  int r;
  event_callback *cb_local;
  event_base *base_local;
  
  cb_local = (event_callback *)base;
  if (base == (event_base *)0x0) {
    cb_local = (event_callback *)event_global_current_base_;
  }
  if (cb_local[10].evcb_arg != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,cb_local[10].evcb_arg);
  }
  if (*(int *)((long)&cb_local[6].evcb_active_next.tqe_next + 4) < 0x21) {
    local_1c = event_callback_activate_nolock_((event_base *)cb_local,cb);
    if (local_1c != 0) {
      *(int *)((long)&cb_local[6].evcb_active_next.tqe_next + 4) =
           *(int *)((long)&cb_local[6].evcb_active_next.tqe_next + 4) + 1;
    }
  }
  else {
    local_1c = event_callback_activate_later_nolock_((event_base *)cb_local,cb);
  }
  if (cb_local[10].evcb_arg != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,cb_local[10].evcb_arg);
  }
  return local_1c;
}

Assistant:

int
event_deferred_cb_schedule_(struct event_base *base, struct event_callback *cb)
{
	int r = 1;
	if (!base)
		base = current_base;
	EVBASE_ACQUIRE_LOCK(base, th_base_lock);
	if (base->n_deferreds_queued > MAX_DEFERREDS_QUEUED) {
		r = event_callback_activate_later_nolock_(base, cb);
	} else {
		r = event_callback_activate_nolock_(base, cb);
		if (r) {
			++base->n_deferreds_queued;
		}
	}
	EVBASE_RELEASE_LOCK(base, th_base_lock);
	return r;
}